

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O2

void Fl::get_color(Fl_Color i,uchar *red,uchar *green,uchar *blue)

{
  if (i < 0x100) {
    i = fl_cmap[i];
  }
  *red = (uchar)(i >> 0x18);
  *green = (uchar)(i >> 0x10);
  *blue = (uchar)(i >> 8);
  return;
}

Assistant:

void Fl::get_color(Fl_Color i, uchar &red, uchar &green, uchar &blue) {
  unsigned c;

  if (i & 0xffffff00) c = (unsigned)i;
  else c = fl_cmap[i];

  red   = uchar(c>>24);
  green = uchar(c>>16);
  blue  = uchar(c>>8);
}